

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O0

void __thiscall board::Board::generateHash(Board *this)

{
  int iVar1;
  int local_20;
  int square;
  int piece;
  uint64_t key;
  Board *this_local;
  
  _square = 0;
  for (local_20 = 0; local_20 < 0x78; local_20 = local_20 + 1) {
    iVar1 = this->board[local_20];
    if ((iVar1 != 99) && (iVar1 != 0)) {
      _square = PIECE_KEYS[iVar1][local_20] ^ _square;
    }
  }
  if (this->enPas != 99) {
    _square = PIECE_KEYS[0][this->enPas] ^ _square;
  }
  if (this->side == 0) {
    _square = SIDE_KEY ^ _square;
  }
  this->hashKey = _square;
  return;
}

Assistant:

void board::Board::generateHash()
{
    uint64_t key = 0;
    int piece;
    for (int square = 0; square < 120; square++) {
        piece = board[square];
        if (piece != NO_SQ && piece != EMPTY) {
            key ^= PIECE_KEYS[piece][square];
        }
    }
    if (enPas != NO_SQ) {
        key ^= PIECE_KEYS[EMPTY][enPas];
    }
    if (side == WHITE) {
        key ^= SIDE_KEY;
    }
    hashKey = key;
}